

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O1

bool __thiscall
glslang::HlslParseContext::constructorError
          (HlslParseContext *this,TSourceLoc *loc,TIntermNode *node,TFunction *function,TOperator op
          ,TType *type)

{
  TVector<glslang::TArraySize> *pTVar1;
  pointer pTVar2;
  pointer pTVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  char cVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  long lVar14;
  undefined4 extraout_var_05;
  TArraySizes *pTVar15;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  TSmallArrayVector *this_00;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  TTypeList *pTVar16;
  char *pcVar17;
  int d;
  uint uVar18;
  ulong uVar19;
  HlslParseContext *this_01;
  undefined4 extraout_var_06;
  
  iVar11 = (*(function->super_TSymbol)._vptr_TSymbol[0xc])(function);
  TType::shallowCopy(type,(TType *)CONCAT44(extraout_var,iVar11));
  if ((op - EOpConstructDMat2x2 < 0x24) || (op - EOpConstructMat2x2 < 9)) {
    bVar10 = true;
  }
  else {
    if (op == EOpConstructTextureSampler) {
      pcVar17 = "unhandled texture constructor";
      goto LAB_00419666;
    }
    bVar10 = false;
  }
  iVar11 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
  if (iVar11 < 1) {
    bVar4 = true;
    iVar11 = 0;
    bVar5 = false;
    bVar8 = false;
    bVar7 = false;
  }
  else {
    bVar4 = true;
    uVar19 = 0;
    bVar7 = false;
    bVar8 = false;
    bVar5 = false;
    bVar6 = false;
    iVar11 = 0;
    do {
      iVar12 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function,uVar19);
      cVar9 = (**(code **)(**(long **)(CONCAT44(extraout_var_00,iVar12) + 8) + 0xe8))();
      if (cVar9 != '\0') {
        iVar12 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function,uVar19);
        cVar9 = (**(code **)(**(long **)(CONCAT44(extraout_var_01,iVar12) + 8) + 0xf8))();
        bVar7 = true;
        if (cVar9 != '\0') {
          pcVar17 = "array argument must be sized";
          goto LAB_00419666;
        }
      }
      if (bVar10) {
        iVar12 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function,uVar19);
        cVar9 = (**(code **)(**(long **)(CONCAT44(extraout_var_02,iVar12) + 8) + 0xe0))();
        if (cVar9 != '\0') {
          bVar8 = true;
        }
      }
      if (bVar6) {
        bVar5 = true;
      }
      iVar12 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function,uVar19);
      iVar12 = TType::computeNumComponents(*(TType **)(CONCAT44(extraout_var_03,iVar12) + 8));
      iVar11 = iVar11 + iVar12;
      if ((op != EOpConstructStruct) &&
         (iVar12 = (*type->_vptr_TType[0x1d])(type), (char)iVar12 == '\0')) {
        iVar12 = TType::computeNumComponents(type);
        if (iVar12 <= iVar11) {
          bVar6 = true;
        }
      }
      iVar12 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function,uVar19);
      lVar14 = (**(code **)(**(long **)(CONCAT44(extraout_var_04,iVar12) + 8) + 0x50))();
      if ((*(uint *)(lVar14 + 8) & 0x7f) != 2) {
        bVar4 = false;
      }
      uVar18 = (int)uVar19 + 1;
      uVar19 = (ulong)uVar18;
      iVar12 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
    } while ((int)uVar18 < iVar12);
  }
  if (bVar4) {
    iVar12 = (*type->_vptr_TType[10])(type);
    *(ulong *)(CONCAT44(extraout_var_05,iVar12) + 8) =
         *(ulong *)(CONCAT44(extraout_var_05,iVar12) + 8) & 0xffffffffffffff80 | 2;
  }
  iVar12 = (*type->_vptr_TType[0x1d])(type);
  if ((char)iVar12 != '\0') {
    iVar12 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
    if (iVar12 == 0) {
      pcVar17 = "array constructor must have at least one argument";
      goto LAB_00419666;
    }
    iVar12 = (*type->_vptr_TType[0x1f])(type);
    if ((char)iVar12 == '\0') {
      iVar12 = (*type->_vptr_TType[0xf])(type);
      iVar13 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
      if ((iVar12 != iVar13) && (iVar12 = TType::computeNumComponents(type), iVar11 < iVar12)) {
        pcVar17 = "array constructor needs one argument per array element";
        goto LAB_00419666;
      }
    }
    else {
      uVar18 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
      pTVar15 = type->arraySizes;
      TSmallArrayVector::changeFront(&pTVar15->sizes,uVar18);
      pTVar15->implicitlySized = false;
    }
    if (((type->arraySizes != (TArraySizes *)0x0) &&
        (pTVar1 = (type->arraySizes->sizes).sizes, pTVar1 != (TVector<glslang::TArraySize> *)0x0))
       && (1 < (int)((ulong)((long)(pTVar1->
                                   super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                   ).
                                   super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(pTVar1->
                                  super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                  ).
                                  super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 4))) {
      iVar12 = (*type->_vptr_TType[0x14])(type);
      pTVar15 = (TArraySizes *)CONCAT44(extraout_var_06,iVar12);
      iVar12 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function,0);
      cVar9 = (**(code **)(**(long **)(CONCAT44(extraout_var_07,iVar12) + 8) + 0xe8))();
      pcVar17 = "array constructor argument not correct type to construct array element";
      if (cVar9 == '\0') goto LAB_00419666;
      pTVar1 = (pTVar15->sizes).sizes;
      iVar12 = 0;
      if (pTVar1 != (TVector<glslang::TArraySize> *)0x0) {
        iVar12 = (int)((ulong)((long)(pTVar1->
                                     super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                     ).
                                     super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pTVar1->
                                    super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                    ).
                                    super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 4);
      }
      iVar13 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])
                         (function,0,
                          "array constructor argument not correct type to construct array element");
      lVar14 = (**(code **)(**(long **)(CONCAT44(extraout_var_08,iVar13) + 8) + 0xa0))();
      lVar14 = *(long *)(lVar14 + 8);
      if (lVar14 == 0) {
        iVar13 = 1;
      }
      else {
        iVar13 = (int)((ulong)(*(long *)(lVar14 + 0x10) - *(long *)(lVar14 + 8)) >> 4) + 1;
      }
      pcVar17 = "array constructor argument not correct type to construct array element";
      if (iVar12 != iVar13) goto LAB_00419666;
      bVar10 = TArraySizes::isInnerUnsized(pTVar15);
      if (bVar10) {
        iVar12 = 1;
        while( true ) {
          pTVar1 = (pTVar15->sizes).sizes;
          iVar13 = 0;
          if (pTVar1 != (TVector<glslang::TArraySize> *)0x0) {
            iVar13 = (int)((ulong)((long)(pTVar1->
                                         super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                         ).
                                         super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pTVar1->
                                        super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                        ).
                                        super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 4);
          }
          if (iVar13 <= iVar12) break;
          uVar18 = TSmallArrayVector::getDimSize((TSmallArrayVector *)pTVar15,iVar12);
          if (uVar18 == 0) {
            iVar13 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function,0);
            this_00 = (TSmallArrayVector *)
                      (**(code **)(**(long **)(CONCAT44(extraout_var_09,iVar13) + 8) + 0xa0))();
            uVar18 = TSmallArrayVector::getDimSize(this_00,iVar12 + -1);
            TSmallArrayVector::setDimSize((TSmallArrayVector *)pTVar15,iVar12,uVar18);
          }
          iVar12 = iVar12 + 1;
        }
      }
    }
  }
  if ((((bVar7) &&
       (iVar12 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function),
       op != EOpConstructStruct)) &&
      ((iVar12 == 1 && (iVar12 = (*type->_vptr_TType[0x1d])(type), (char)iVar12 != '\0')))) &&
     (((type->arraySizes == (TArraySizes *)0x0 ||
       (pTVar1 = (type->arraySizes->sizes).sizes, pTVar1 == (TVector<glslang::TArraySize> *)0x0)) ||
      ((int)((ulong)((long)(pTVar1->
                           super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                           ).
                           super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pTVar1->
                          super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                          ).
                          super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 4) < 2)))) {
    iVar12 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function,0);
    lVar14 = *(long *)(*(long *)(CONCAT44(extraout_var_10,iVar12) + 8) + 0x60);
    if ((((lVar14 == 0) || (lVar14 = *(long *)(lVar14 + 8), lVar14 == 0)) ||
        ((int)((ulong)(*(long *)(lVar14 + 0x10) - *(long *)(lVar14 + 8)) >> 4) < 2)) &&
       (iVar12 = (*type->_vptr_TType[0xc])(type), 0 < iVar12)) {
      iVar12 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function,0);
      iVar12 = (**(code **)(**(long **)(CONCAT44(extraout_var_11,iVar12) + 8) + 0x60))();
      if (0 < iVar12) {
        return false;
      }
    }
  }
  if (bVar7 == true && op != EOpConstructStruct) {
    pcVar17 = "constructing non-array constituent from array argument";
    if (((type->arraySizes == (TArraySizes *)0x0) ||
        (pTVar1 = (type->arraySizes->sizes).sizes, pTVar1 == (TVector<glslang::TArraySize> *)0x0))
       || ((int)((ulong)((long)(pTVar1->
                               super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                               ).
                               super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pTVar1->
                              super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                              ).
                              super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 4) < 2))
    goto LAB_00419666;
  }
  if ((bVar8) && (iVar12 = (*type->_vptr_TType[0x1d])(type), (char)iVar12 == '\0')) {
    return false;
  }
  if (bVar5) {
    pcVar17 = "too many arguments";
  }
  else {
    if ((op == EOpConstructStruct) &&
       (this_01 = (HlslParseContext *)type, iVar12 = (*type->_vptr_TType[0x1d])(),
       (char)iVar12 == '\0')) {
      bVar10 = isScalarConstructor(this_01,node);
      if (bVar10) {
        return false;
      }
      iVar12 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
      if (iVar12 == 1) {
        iVar12 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function,0);
        bVar10 = TType::operator==(type,*(TType **)(CONCAT44(extraout_var_12,iVar12) + 8));
        if (bVar10) {
          return false;
        }
      }
      pTVar16 = TType::getStruct(type);
      pTVar2 = (pTVar16->
               super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
               super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      pTVar3 = (pTVar16->
               super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
               super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
               _M_impl.super__Vector_impl_data._M_start;
      iVar12 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
      if (iVar12 != (int)((ulong)((long)pTVar2 - (long)pTVar3) >> 5)) {
        pcVar17 = "Number of constructor parameters does not match the number of structure fields";
        goto LAB_00419666;
      }
    }
    if (((op == EOpConstructStruct) || (iVar11 == 1)) ||
       (iVar12 = TType::computeNumComponents(type), iVar12 <= iVar11)) {
      if (op != EOpConstructStruct) {
        return false;
      }
      iVar12 = TType::computeNumComponents(type);
      if (iVar12 <= iVar11) {
        return false;
      }
    }
    pcVar17 = "not enough data provided for construction";
  }
LAB_00419666:
  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
            (this,loc,pcVar17,"constructor","");
  return true;
}

Assistant:

bool HlslParseContext::constructorError(const TSourceLoc& loc, TIntermNode* node, TFunction& function,
                                        TOperator op, TType& type)
{
    type.shallowCopy(function.getType());

    bool constructingMatrix = false;
    switch (op) {
    case EOpConstructTextureSampler:
        error(loc, "unhandled texture constructor", "constructor", "");
        return true;
    case EOpConstructMat2x2:
    case EOpConstructMat2x3:
    case EOpConstructMat2x4:
    case EOpConstructMat3x2:
    case EOpConstructMat3x3:
    case EOpConstructMat3x4:
    case EOpConstructMat4x2:
    case EOpConstructMat4x3:
    case EOpConstructMat4x4:
    case EOpConstructDMat2x2:
    case EOpConstructDMat2x3:
    case EOpConstructDMat2x4:
    case EOpConstructDMat3x2:
    case EOpConstructDMat3x3:
    case EOpConstructDMat3x4:
    case EOpConstructDMat4x2:
    case EOpConstructDMat4x3:
    case EOpConstructDMat4x4:
    case EOpConstructIMat2x2:
    case EOpConstructIMat2x3:
    case EOpConstructIMat2x4:
    case EOpConstructIMat3x2:
    case EOpConstructIMat3x3:
    case EOpConstructIMat3x4:
    case EOpConstructIMat4x2:
    case EOpConstructIMat4x3:
    case EOpConstructIMat4x4:
    case EOpConstructUMat2x2:
    case EOpConstructUMat2x3:
    case EOpConstructUMat2x4:
    case EOpConstructUMat3x2:
    case EOpConstructUMat3x3:
    case EOpConstructUMat3x4:
    case EOpConstructUMat4x2:
    case EOpConstructUMat4x3:
    case EOpConstructUMat4x4:
    case EOpConstructBMat2x2:
    case EOpConstructBMat2x3:
    case EOpConstructBMat2x4:
    case EOpConstructBMat3x2:
    case EOpConstructBMat3x3:
    case EOpConstructBMat3x4:
    case EOpConstructBMat4x2:
    case EOpConstructBMat4x3:
    case EOpConstructBMat4x4:
        constructingMatrix = true;
        break;
    default:
        break;
    }

    //
    // Walk the arguments for first-pass checks and collection of information.
    //

    int size = 0;
    bool constType = true;
    bool full = false;
    bool overFull = false;
    bool matrixInMatrix = false;
    bool arrayArg = false;
    for (int arg = 0; arg < function.getParamCount(); ++arg) {
        if (function[arg].type->isArray()) {
            if (function[arg].type->isUnsizedArray()) {
                // Can't construct from an unsized array.
                error(loc, "array argument must be sized", "constructor", "");
                return true;
            }
            arrayArg = true;
        }
        if (constructingMatrix && function[arg].type->isMatrix())
            matrixInMatrix = true;

        // 'full' will go to true when enough args have been seen.  If we loop
        // again, there is an extra argument.
        if (full) {
            // For vectors and matrices, it's okay to have too many components
            // available, but not okay to have unused arguments.
            overFull = true;
        }

        size += function[arg].type->computeNumComponents();
        if (op != EOpConstructStruct && ! type.isArray() && size >= type.computeNumComponents())
            full = true;

        if (function[arg].type->getQualifier().storage != EvqConst)
            constType = false;
    }

    if (constType)
        type.getQualifier().storage = EvqConst;

    if (type.isArray()) {
        if (function.getParamCount() == 0) {
            error(loc, "array constructor must have at least one argument", "constructor", "");
            return true;
        }

        if (type.isUnsizedArray()) {
            // auto adapt the constructor type to the number of arguments
            type.changeOuterArraySize(function.getParamCount());
        } else if (type.getOuterArraySize() != function.getParamCount() && type.computeNumComponents() > size) {
            error(loc, "array constructor needs one argument per array element", "constructor", "");
            return true;
        }

        if (type.isArrayOfArrays()) {
            // Types have to match, but we're still making the type.
            // Finish making the type, and the comparison is done later
            // when checking for conversion.
            TArraySizes& arraySizes = *type.getArraySizes();

            // At least the dimensionalities have to match.
            if (! function[0].type->isArray() ||
                arraySizes.getNumDims() != function[0].type->getArraySizes()->getNumDims() + 1) {
                error(loc, "array constructor argument not correct type to construct array element", "constructor", "");
                return true;
            }

            if (arraySizes.isInnerUnsized()) {
                // "Arrays of arrays ..., and the size for any dimension is optional"
                // That means we need to adopt (from the first argument) the other array sizes into the type.
                for (int d = 1; d < arraySizes.getNumDims(); ++d) {
                    if (arraySizes.getDimSize(d) == UnsizedArraySize) {
                        arraySizes.setDimSize(d, function[0].type->getArraySizes()->getDimSize(d - 1));
                    }
                }
            }
        }
    }

    // Some array -> array type casts are okay
    if (arrayArg && function.getParamCount() == 1 && op != EOpConstructStruct && type.isArray() &&
        !type.isArrayOfArrays() && !function[0].type->isArrayOfArrays() &&
        type.getVectorSize() >= 1 && function[0].type->getVectorSize() >= 1)
        return false;

    if (arrayArg && op != EOpConstructStruct && ! type.isArrayOfArrays()) {
        error(loc, "constructing non-array constituent from array argument", "constructor", "");
        return true;
    }

    if (matrixInMatrix && ! type.isArray()) {
        return false;
    }

    if (overFull) {
        error(loc, "too many arguments", "constructor", "");
        return true;
    }

    if (op == EOpConstructStruct && ! type.isArray()) {
        if (isScalarConstructor(node))
            return false;

        // Self-type construction: e.g, we can construct a struct from a single identically typed object.
        if (function.getParamCount() == 1 && type == *function[0].type)
            return false;

        if ((int)type.getStruct()->size() != function.getParamCount()) {
            error(loc, "Number of constructor parameters does not match the number of structure fields", "constructor", "");
            return true;
        }
    }

    if ((op != EOpConstructStruct && size != 1 && size < type.computeNumComponents()) ||
        (op == EOpConstructStruct && size < type.computeNumComponents())) {
        error(loc, "not enough data provided for construction", "constructor", "");
        return true;
    }

    return false;
}